

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3OomFault(sqlite3 *db)

{
  long in_RDI;
  Parse *pParse;
  long local_18;
  
  if ((*(char *)(in_RDI + 0x67) == '\0') && (*(char *)(in_RDI + 0x68) == '\0')) {
    *(undefined1 *)(in_RDI + 0x67) = 1;
    if (0 < *(int *)(in_RDI + 0xdc)) {
      *(undefined4 *)(in_RDI + 400) = 1;
    }
    *(int *)(in_RDI + 0x198) = *(int *)(in_RDI + 0x198) + 1;
    *(undefined2 *)(in_RDI + 0x19c) = 0;
    if (*(long *)(in_RDI + 0x158) != 0) {
      sqlite3ErrorMsg(*(Parse **)(in_RDI + 0x158),"out of memory");
      *(undefined4 *)(*(long *)(in_RDI + 0x158) + 0x18) = 7;
      for (local_18 = *(long *)(*(long *)(in_RDI + 0x158) + 0x108); local_18 != 0;
          local_18 = *(long *)(local_18 + 0x108)) {
        *(int *)(local_18 + 0x34) = *(int *)(local_18 + 0x34) + 1;
        *(undefined4 *)(local_18 + 0x18) = 7;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE void *sqlite3OomFault(sqlite3 *db){
  if( db->mallocFailed==0 && db->bBenignMalloc==0 ){
    db->mallocFailed = 1;
    if( db->nVdbeExec>0 ){
      AtomicStore(&db->u1.isInterrupted, 1);
    }
    DisableLookaside;
    if( db->pParse ){
      Parse *pParse;
      sqlite3ErrorMsg(db->pParse, "out of memory");
      db->pParse->rc = SQLITE_NOMEM_BKPT;
      for(pParse=db->pParse->pOuterParse; pParse; pParse = pParse->pOuterParse){
        pParse->nErr++;
        pParse->rc = SQLITE_NOMEM;
      }
    }
  }
  return 0;
}